

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_regex.cpp
# Opt level: O2

Language * Omega_h::regex::build_language(void)

{
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *this;
  Language *in_RDI;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  allocator local_e5;
  allocator_type local_e4;
  allocator local_e3;
  allocator local_e2;
  allocator_type local_e1;
  Production local_e0;
  undefined1 local_a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_68 [32];
  string local_48 [39];
  allocator_type local_21;
  
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &in_RDI->productions;
  std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::resize
            (this,0x16);
  std::__cxx11::string::string((string *)local_a8,"regex",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"union",&local_e3);
  __l._M_len = 1;
  __l._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)local_a8,"union",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"concat",&local_e3);
  __l_00._M_len = 1;
  __l_00._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_00,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"union",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"union",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"|",(allocator *)&local_e4);
  std::__cxx11::string::string(local_68,"concat",&local_e2);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_01,&local_e1);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_a8,"concat",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"qualified",&local_e3);
  __l_02._M_len = 1;
  __l_02._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_02,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"concat",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"concat",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"qualified",(allocator *)&local_e4);
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_03,(allocator_type *)&local_e2);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 4,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_a8,"qualified",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"single",&local_e3);
  __l_04._M_len = 1;
  __l_04._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_04,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"qualified",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"qualified",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"*",(allocator *)&local_e4);
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_05,(allocator_type *)&local_e2);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 6,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_e0,"qualified",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"qualified",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"+",(allocator *)&local_e4);
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_06,(allocator_type *)&local_e2);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 7,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_e0,"qualified",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"qualified",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"?",(allocator *)&local_e4);
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_07,(allocator_type *)&local_e2);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 8,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_a8,"single",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"char",&local_e3);
  __l_08._M_len = 1;
  __l_08._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_08,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 9,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)local_a8,"single",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,".",&local_e3);
  __l_09._M_len = 1;
  __l_09._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_09,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 10,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)local_a8,"single",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"set",&local_e3);
  __l_10._M_len = 1;
  __l_10._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_10,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xb,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"single",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"(",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"union",(allocator *)&local_e4);
  std::__cxx11::string::string(local_68,")",&local_e2);
  __l_11._M_len = 3;
  __l_11._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_11,&local_e1);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xc,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_a8,"set",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"positive-set",&local_e3);
  __l_12._M_len = 1;
  __l_12._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_12,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xd,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)local_a8,"set",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"negative-set",&local_e3);
  __l_13._M_len = 1;
  __l_13._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_13,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xe,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"positive-set",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"[",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"set-items",(allocator *)&local_e4);
  std::__cxx11::string::string(local_68,"]",&local_e2);
  __l_14._M_len = 3;
  __l_14._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_14,&local_e1);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0xf,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_e0,"negative-set",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"[",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"^",(allocator *)&local_e4);
  std::__cxx11::string::string(local_68,"set-items",&local_e2);
  std::__cxx11::string::string(local_48,"]",(allocator *)&local_e1);
  __l_15._M_len = 4;
  __l_15._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_15,&local_21);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x10,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_a8,"set-items",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"set-item",&local_e3);
  __l_16._M_len = 1;
  __l_16._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_16,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x11,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"set-items",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"set-items",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"set-item",(allocator *)&local_e4);
  __l_17._M_len = 2;
  __l_17._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_17,(allocator_type *)&local_e2);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x12,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)local_a8,"set-item",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"char",&local_e3);
  __l_18._M_len = 1;
  __l_18._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_18,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x13,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)local_a8,"set-item",&local_e5);
  std::__cxx11::string::string((string *)&local_e0,"range",&local_e3);
  __l_19._M_len = 1;
  __l_19._M_array = &local_e0.lhs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l_19,&local_e4);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x14,(Production *)local_a8);
  Language::Production::~Production((Production *)local_a8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&local_e0,"range",&local_e5);
  std::__cxx11::string::string((string *)local_a8,"char",&local_e3);
  std::__cxx11::string::string((string *)&local_88,"-",(allocator *)&local_e4);
  std::__cxx11::string::string(local_68,"char",&local_e2);
  __l_20._M_len = 3;
  __l_20._M_array = (iterator)local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0.rhs,__l_20,&local_e1);
  Language::Production::operator=
            ((this->
             super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
             )._M_impl.super__Vector_impl_data._M_start + 0x15,&local_e0);
  Language::Production::~Production(&local_e0);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_a8 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&in_RDI->tokens,0xc);
  std::__cxx11::string::string((string *)local_a8,"char",(allocator *)&local_e0);
  std::__cxx11::string::string
            ((string *)&local_88,"[^\\\\\\.\\[\\]\\(\\)\\|\\-\\^\\*\\+\\?]|\\\\.",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,".",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\.",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"[",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\]",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"]",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\]",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"(",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\(",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,")",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\)",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"|",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\|",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 6,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"-",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\-",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 7,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"^",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\^",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"*",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\*",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 9,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"+",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\+",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  std::__cxx11::string::string((string *)local_a8,"?",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&local_88,"\\?",&local_e5);
  Language::Token::operator=
            ((in_RDI->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(Token *)local_a8);
  Language::Token::~Token((Token *)local_a8);
  return in_RDI;
}

Assistant:

Language build_language() {
  /* The top produtions were from the "grep.y" YACC grammar in the source
     code for Plan 9's grep utility, see here:
https://github.com/wangeguo/plan9/blob/master/sys/src/cmd/grep/grep.y
     The "set" related productions
     are from a grammar intended to be used by ProLog to parse Perl's regular
     expressions, see here:
http://www.cs.sfu.ca/~cameron/Teaching/384/99-3/regexp-plg.html */
  Language out;
  auto& prods = out.productions;
  prods.resize(NPRODS);
  prods[PROD_REGEX] = {"regex", {"union"}};
  prods[PROD_UNION_DECAY] = {"union", {"concat"}};
  prods[PROD_UNION] = {"union", {"union", "|", "concat"}};  // union
  prods[PROD_CONCAT_DECAY] = {"concat", {"qualified"}};
  prods[PROD_CONCAT] = {"concat", {"concat", "qualified"}};  // concatenation
  prods[PROD_QUAL_DECAY] = {"qualified", {"single"}};
  prods[PROD_STAR] = {"qualified", {"qualified", "*"}};
  prods[PROD_PLUS] = {"qualified", {"qualified", "+"}};
  prods[PROD_MAYBE] = {"qualified", {"qualified", "?"}};
  prods[PROD_SINGLE_CHAR] = {"single", {"char"}};
  prods[PROD_ANY] = {"single", {"."}};  // any
  prods[PROD_SINGLE_SET] = {"single", {"set"}};
  prods[PROD_PARENS_UNION] = {"single", {"(", "union", ")"}};
  prods[PROD_SET_POSITIVE] = {"set", {"positive-set"}};
  prods[PROD_SET_NEGATIVE] = {"set", {"negative-set"}};
  prods[PROD_POSITIVE_SET] = {"positive-set", {"[", "set-items", "]"}};
  prods[PROD_NEGATIVE_SET] = {"negative-set", {"[", "^", "set-items", "]"}};
  prods[PROD_SET_ITEMS_DECAY] = {"set-items", {"set-item"}};
  prods[PROD_SET_ITEMS_ADD] = {"set-items", {"set-items", "set-item"}};
  prods[PROD_SET_ITEM_CHAR] = {"set-item", {"char"}};
  prods[PROD_SET_ITEM_RANGE] = {"set-item", {"range"}};
  prods[PROD_RANGE] = {"range", {"char", "-", "char"}};
  out.tokens.resize(NTOKS);
  /* either one of the non-meta characters, or anything preceded by the escape
   * slash */
  out.tokens[TOK_CHAR] = {
      "char", "[^\\\\\\.\\[\\]\\(\\)\\|\\-\\^\\*\\+\\?]|\\\\."};
  out.tokens[TOK_DOT] = {".", "\\."};
  out.tokens[TOK_LRANGE] = {"[", "\\]"};
  out.tokens[TOK_RRANGE] = {"]", "\\]"};
  out.tokens[TOK_LPAREN] = {"(", "\\("};
  out.tokens[TOK_RPAREN] = {")", "\\)"};
  out.tokens[TOK_UNION] = {"|", "\\|"};
  out.tokens[TOK_RANGE] = {"-", "\\-"};
  out.tokens[TOK_NEGATE] = {"^", "\\^"};
  out.tokens[TOK_STAR] = {"*", "\\*"};
  out.tokens[TOK_PLUS] = {"+", "\\+"};
  out.tokens[TOK_MAYBE] = {"?", "\\?"};
  return out;
}